

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O0

BLOB_RESULT
Blob_PutBlock(HTTPAPIEX_HANDLE httpApiExHandle,char *relativePath,uint blockID,
             BUFFER_HANDLE blockData,SINGLYLINKEDLIST_HANDLE blockIDList,uint *httpStatus,
             BUFFER_HANDLE httpResponse)

{
  int iVar1;
  HTTPAPIEX_RESULT HVar2;
  LOGGER_LOG p_Var3;
  char *relativePath_00;
  undefined4 uVar4;
  LOGGER_LOG l_7;
  LOGGER_LOG p_Stack_a8;
  uint httpResponseStatusCode;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  STRING_HANDLE newRelativePath;
  LOGGER_LOG l_4;
  LIST_ITEM_HANDLE newListItem;
  LOGGER_LOG l_3;
  STRING_HANDLE blockIdEncodedString;
  LOGGER_LOG l_2;
  LOGGER_LOG p_Stack_60;
  char blockIdString [7];
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BLOB_RESULT result;
  uint *httpStatus_local;
  SINGLYLINKEDLIST_HANDLE blockIDList_local;
  BUFFER_HANDLE blockData_local;
  uint blockID_local;
  char *relativePath_local;
  HTTPAPIEX_HANDLE httpApiExHandle_local;
  
  if ((((httpApiExHandle == (HTTPAPIEX_HANDLE)0x0) || (relativePath == (char *)0x0)) ||
      (blockData == (BUFFER_HANDLE)0x0)) || (blockIDList == (SINGLYLINKEDLIST_HANDLE)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"Blob_PutBlock",0x97,1,
                "invalid argument detected blockData=%p blockIDList=%p relativePath=%p httpApiExHandle=%p"
                ,blockData,blockIDList,relativePath,httpApiExHandle);
    }
    l._4_4_ = BLOB_ERROR;
  }
  else if (blockID < 50000) {
    iVar1 = sprintf((char *)((long)&l_2 + 1),"%6u",(ulong)blockID);
    if (iVar1 == 6) {
      l_3 = (LOGGER_LOG)Azure_Base64_Encode_Bytes((uchar *)((long)&l_2 + 1),6);
      if ((STRING_HANDLE)l_3 == (STRING_HANDLE)0x0) {
        newListItem = (LIST_ITEM_HANDLE)xlogging_get_log_function();
        if (newListItem != (LIST_ITEM_HANDLE)0x0) {
          (*(code *)newListItem)
                    (0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                     ,"Blob_PutBlock",0xad,1,"unable to Azure_Base64_Encode_Bytes");
        }
        l._4_4_ = BLOB_ERROR;
      }
      else {
        l_4 = (LOGGER_LOG)singlylinkedlist_add(blockIDList,l_3);
        if ((LIST_ITEM_HANDLE)l_4 == (LIST_ITEM_HANDLE)0x0) {
          newRelativePath = (STRING_HANDLE)xlogging_get_log_function();
          if (newRelativePath != (STRING_HANDLE)0x0) {
            (*(code *)newRelativePath)
                      (0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                       ,"Blob_PutBlock",0xb7,1,"unable to store block ID");
          }
          STRING_delete((STRING_HANDLE)l_3);
          l._4_4_ = BLOB_ERROR;
        }
        else {
          l_5 = (LOGGER_LOG)STRING_construct(relativePath);
          if ((STRING_HANDLE)l_5 == (STRING_HANDLE)0x0) {
            l_6 = xlogging_get_log_function();
            if (l_6 != (LOGGER_LOG)0x0) {
              (*l_6)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                     ,"Blob_PutBlock",0xc1,1,"unable to STRING_construct");
            }
            singlylinkedlist_remove(blockIDList,(LIST_ITEM_HANDLE)l_4);
            STRING_delete((STRING_HANDLE)l_3);
            l._4_4_ = BLOB_ERROR;
          }
          else {
            iVar1 = STRING_concat((STRING_HANDLE)l_5,"&comp=block&blockid=");
            if ((iVar1 == 0) &&
               (iVar1 = STRING_concat_with_STRING((STRING_HANDLE)l_5,(STRING_HANDLE)l_3), iVar1 == 0
               )) {
              l_7._4_4_ = 0;
              relativePath_00 = STRING_c_str((STRING_HANDLE)l_5);
              uVar4 = 0;
              HVar2 = HTTPAPIEX_ExecuteRequest
                                (httpApiExHandle,HTTPAPI_REQUEST_PUT,relativePath_00,
                                 (HTTP_HEADERS_HANDLE)0x0,blockData,(uint *)((long)&l_7 + 4),
                                 (HTTP_HEADERS_HANDLE)0x0,httpResponse);
              if (((HVar2 == HTTPAPIEX_OK) && (99 < l_7._4_4_)) && (l_7._4_4_ < 300)) {
                l._4_4_ = BLOB_OK;
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                            ,"Blob_PutBlock",0xe1,1,
                            "unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)",
                            CONCAT44(uVar4,l_7._4_4_));
                }
                singlylinkedlist_remove(blockIDList,(LIST_ITEM_HANDLE)l_4);
                STRING_delete((STRING_HANDLE)l_3);
                l._4_4_ = BLOB_HTTP_ERROR;
              }
              if (httpStatus != (uint *)0x0) {
                *httpStatus = l_7._4_4_;
              }
            }
            else {
              p_Stack_a8 = xlogging_get_log_function();
              if (p_Stack_a8 != (LOGGER_LOG)0x0) {
                (*p_Stack_a8)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                              ,"Blob_PutBlock",0xcd,1,"unable to STRING concatenate");
              }
              singlylinkedlist_remove(blockIDList,(LIST_ITEM_HANDLE)l_4);
              STRING_delete((STRING_HANDLE)l_3);
              l._4_4_ = BLOB_ERROR;
            }
            STRING_delete((STRING_HANDLE)l_5);
          }
        }
      }
    }
    else {
      blockIdEncodedString = (STRING_HANDLE)xlogging_get_log_function();
      if (blockIdEncodedString != (STRING_HANDLE)0x0) {
        (*(code *)blockIdEncodedString)
                  (0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                   ,"Blob_PutBlock",0xa4,1,"failed to sprintf");
      }
      l._4_4_ = BLOB_ERROR;
    }
  }
  else {
    p_Stack_60 = xlogging_get_log_function();
    if (p_Stack_60 != (LOGGER_LOG)0x0) {
      (*p_Stack_60)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                    ,"Blob_PutBlock",0x9c,1,"block ID too large");
    }
    l._4_4_ = BLOB_ERROR;
  }
  return l._4_4_;
}

Assistant:

BLOB_RESULT Blob_PutBlock(
        HTTPAPIEX_HANDLE httpApiExHandle,
        const char* relativePath,
        unsigned int blockID,
        BUFFER_HANDLE blockData,
        SINGLYLINKEDLIST_HANDLE blockIDList,
        unsigned int* httpStatus,
        BUFFER_HANDLE httpResponse)
{
    BLOB_RESULT result;

    if (httpApiExHandle == NULL ||
        relativePath == NULL ||
        blockData == NULL ||
        blockIDList == NULL)
    {
        LogError("invalid argument detected blockData=%p blockIDList=%p relativePath=%p httpApiExHandle=%p", blockData, blockIDList, relativePath, httpApiExHandle);
        result = BLOB_ERROR;
    }
    else if (blockID > 49999) /*outside the expected range of 000000... 049999*/
    {
        LogError("block ID too large");
        result = BLOB_ERROR;
    }
    else
    {   
        char blockIdString[AZURE_BLOB_BLOCK_ID_SIZE]; /*this will contain 000000... 049999*/
        if (sprintf(blockIdString, "%6u", (unsigned int)blockID) != AZURE_BLOB_BLOCK_ID_LENGTH) /*produces 000000... 049999*/
        {
            LogError("failed to sprintf");
            result = BLOB_ERROR;
        }
        else
        {
            STRING_HANDLE blockIdEncodedString = Azure_Base64_Encode_Bytes((const unsigned char*)blockIdString, AZURE_BLOB_BLOCK_ID_LENGTH);

            if (blockIdEncodedString == NULL)
            {
                LogError("unable to Azure_Base64_Encode_Bytes");
                result = BLOB_ERROR;
            }
            else
            {
                LIST_ITEM_HANDLE newListItem = singlylinkedlist_add(blockIDList, blockIdEncodedString);

                /*add the blockId base64 encoded to the XML*/
                if (newListItem == NULL)
                {
                    LogError("unable to store block ID");
                    STRING_delete(blockIdEncodedString);
                    result = BLOB_ERROR;
                }
                else
                {
                    STRING_HANDLE newRelativePath = STRING_construct(relativePath);

                    if (newRelativePath == NULL)
                    {
                        LogError("unable to STRING_construct");
                        (void)singlylinkedlist_remove(blockIDList, newListItem);
                        STRING_delete(blockIdEncodedString);
                        result = BLOB_ERROR;
                    }
                    else
                    {
                        if (!(
                            (STRING_concat(newRelativePath, "&comp=block&blockid=") == 0) &&
                            (STRING_concat_with_STRING(newRelativePath, blockIdEncodedString) == 0)
                            ))
                        {
                            LogError("unable to STRING concatenate");
                            (void)singlylinkedlist_remove(blockIDList, newListItem);
                            STRING_delete(blockIdEncodedString);
                            result = BLOB_ERROR;
                        }
                        else
                        {
                            unsigned int httpResponseStatusCode = 0;

                            if (HTTPAPIEX_ExecuteRequest(
                                    httpApiExHandle,
                                    HTTPAPI_REQUEST_PUT,
                                    STRING_c_str(newRelativePath),
                                    NULL,
                                    blockData,
                                    &httpResponseStatusCode,
                                    NULL,
                                    httpResponse) != HTTPAPIEX_OK ||
                                    !IS_HTTP_STATUS_CODE_SUCCESS(httpResponseStatusCode))
                            {
                                LogError("unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)", httpResponseStatusCode);
                                (void)singlylinkedlist_remove(blockIDList, newListItem);
                                STRING_delete(blockIdEncodedString);
                                result = BLOB_HTTP_ERROR;
                            }
                            else
                            {
                                result = BLOB_OK;
                            }

                            if (httpStatus != NULL)
                            {
                                *httpStatus = httpResponseStatusCode;
                            }
                        }

                        STRING_delete(newRelativePath);
                    }
                }
            }
        }
    }
    return result;
}